

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O3

void __thiscall setup::info::info(info *this)

{
  (this->version).value = 0;
  (this->version).variant._flags.super__Base_bitset<1UL>._M_w = 0;
  (this->version).known = false;
  this->codepage = 0;
  header::header(&this->header);
  memset(&this->components,0,0x1b0);
  (this->decompressor_dll)._M_dataplus._M_p = (pointer)&(this->decompressor_dll).field_2;
  (this->decompressor_dll)._M_string_length = 0;
  (this->decompressor_dll).field_2._M_local_buf[0] = '\0';
  (this->decrypt_dll)._M_dataplus._M_p = (pointer)&(this->decrypt_dll).field_2;
  (this->decrypt_dll)._M_string_length = 0;
  (this->decrypt_dll).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

info::info() : codepage(0) { }